

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

void __thiscall deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(AttributeSpec *this)

{
  this->inputType = INPUTTYPE_LAST;
  this->outputType = OUTPUTTYPE_LAST;
  this->storage = STORAGE_LAST;
  this->usage = USAGE_LAST;
  this->componentCount = 0;
  this->offset = 0;
  *(undefined8 *)((long)&this->offset + 1) = 0;
  this->instanceDivisor = 0;
  *(undefined4 *)((long)&this->instanceDivisor + 3) = 0;
  return;
}

Assistant:

DrawTestSpec::AttributeSpec::AttributeSpec (void)
{
	inputType					= DrawTestSpec::INPUTTYPE_LAST;
	outputType					= DrawTestSpec::OUTPUTTYPE_LAST;
	storage						= DrawTestSpec::STORAGE_LAST;
	usage						= DrawTestSpec::USAGE_LAST;
	componentCount				= 0;
	offset						= 0;
	stride						= 0;
	normalize					= false;
	instanceDivisor				= 0;
	useDefaultAttribute			= false;
	additionalPositionAttribute = false;
	bgraComponentOrder			= false;
}